

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool __thiscall
duckdb::BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t>::
Flush<duckdb::BitpackingCompressionState<duckdb::uhugeint_t,true,duckdb::hugeint_t>::BitpackingWriter>
          (BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t> *this)

{
  BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t> BVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  idx_t iVar5;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_01;
  uint64_t uVar6;
  uhugeint_t uVar7;
  uhugeint_t value;
  uhugeint_t value_00;
  uhugeint_t frame_of_reference;
  void *in_stack_ffffffffffffffb0;
  uint64_t extraout_RDX_00;
  
  if (*(long *)(this + 0x10818) == 0) {
    return true;
  }
  if (((this[0x108a1] != (BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t>)0x0) ||
      (bVar2 = uhugeint_t::operator==((uhugeint_t *)(this + 0x10840),(uhugeint_t *)(this + 0x10830))
      , bVar2)) && ((byte)((char)this[0x108a4] - 1U) < 2)) {
    BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
    WriteConstant(*(uhugeint_t *)(this + 0x10840),*(idx_t *)(this + 0x10818),
                  *(void **)(this + 0x10828),(bool)this[0x108a1]);
    *(long *)(this + 0x10820) = *(long *)(this + 0x10820) + 0x14;
    return true;
  }
  BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::CalculateFORStats
            ((BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *)this);
  BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::CalculateDeltaStats
            ((BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *)this);
  uVar6 = extraout_RDX;
  if (this[0x108a2] == (BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t>)0x1) {
    bVar2 = hugeint_t::operator==((hugeint_t *)(this + 0x10870),(hugeint_t *)(this + 0x10860));
    if ((bVar2) && (((byte)this[0x108a4] & 0xfe) != 4)) {
      BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
      WriteConstantDelta(*(hugeint_t *)(this + 0x10870),**(uhugeint_t **)(this + 0x8010),
                         *(idx_t *)(this + 0x10818),*(uhugeint_t **)(this + 0x8010),
                         (bool *)(this + 0x10018),*(void **)(this + 0x10828));
      *(long *)(this + 0x10820) = *(long *)(this + 0x10820) + 0x24;
      return true;
    }
    uVar7 = hugeint_t::operator_cast_to_uhugeint_t((hugeint_t *)(this + 0x10880));
    value.upper = uVar7.upper;
    value.lower = value.upper;
    bVar3 = BitpackingPrimitives::MinimumBitWidth<duckdb::uhugeint_t,false>
                      ((BitpackingPrimitives *)uVar7.lower,value);
    uVar7.upper = extraout_RDX_00;
    uVar7.lower = *(uint64_t *)(this + 0x10858);
    bVar4 = BitpackingPrimitives::MinimumBitWidth<duckdb::uhugeint_t,false>
                      (*(BitpackingPrimitives **)(this + 0x10850),uVar7);
    uVar6 = extraout_RDX_01;
    if ((bVar3 < bVar4) &&
       (this[0x108a4] != (BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t>)0x5)) {
      BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::
      SubtractFrameOfReference<duckdb::hugeint_t>
                ((BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *)this,
                 (hugeint_t *)(this + 0x8018),*(hugeint_t *)(this + 0x10860));
      uVar7 = hugeint_t::operator_cast_to_uhugeint_t((hugeint_t *)(this + 0x10860));
      BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
      WriteDeltaFor((uhugeint_t *)(this + 0x8018),(bool *)(this + 0x10018),bVar3,uVar7,
                    *(hugeint_t *)(this + 0x10890),*(uhugeint_t **)(this + 0x8010),
                    *(idx_t *)(this + 0x10818),*(void **)(this + 0x10828));
      *(long *)(this + 0x10820) = *(long *)(this + 0x10820) + 0x28;
      iVar5 = BitpackingPrimitives::GetRequiredSize(*(idx_t *)(this + 0x10818),bVar3);
      *(idx_t *)(this + 0x10820) = *(long *)(this + 0x10820) + iVar5;
      return true;
    }
  }
  BVar1 = this[0x108a3];
  if (BVar1 == (BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t>)0x1) {
    value_00.upper = uVar6;
    value_00.lower = *(uint64_t *)(this + 0x10858);
    bVar3 = BitpackingPrimitives::MinimumBitWidth<duckdb::uhugeint_t,false>
                      (*(BitpackingPrimitives **)(this + 0x10850),value_00);
    BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::
    SubtractFrameOfReference<duckdb::uhugeint_t>
              ((BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *)this,
               *(uhugeint_t **)(this + 0x8010),*(uhugeint_t *)(this + 0x10830));
    frame_of_reference.upper = *(uint64_t *)(this + 0x10818);
    frame_of_reference.lower = *(uint64_t *)(this + 0x10838);
    BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
    WriteFor(*(BitpackingWriter **)(this + 0x8010),(uhugeint_t *)(this + 0x10018),
             (bool *)(ulong)bVar3,(bitpacking_width_t)*(undefined8 *)(this + 0x10830),
             frame_of_reference,*(idx_t *)(this + 0x10828),in_stack_ffffffffffffffb0);
    iVar5 = BitpackingPrimitives::GetRequiredSize(*(idx_t *)(this + 0x10818),bVar3);
    *(idx_t *)(this + 0x10820) = iVar5 + *(long *)(this + 0x10820) + 0x18;
  }
  return BVar1 == (BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t>)0x1;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}